

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cc
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
wabt::Opcode::GetBytes
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          Opcode *this)

{
  Enum EVar1;
  ulong uVar2;
  Offset OVar3;
  char cVar4;
  uint32_t value;
  uint8_t buffer [5];
  uchar local_1f;
  uchar local_1e;
  uint8_t local_1d [5];
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  EVar1 = this->enum_;
  uVar2 = (ulong)EVar1;
  if (uVar2 < 0x21c) {
    cVar4 = infos_[uVar2 * 0x48 + 0x38];
  }
  else {
    cVar4 = (char)(-EVar1 >> 9);
  }
  if (cVar4 == '\0') {
    if (EVar1 < Invalid) {
      local_1f = (uchar)*(undefined4 *)(infos_ + uVar2 * 0x48 + 0x3c);
    }
    else {
      local_1f = -(char)EVar1;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_1f);
  }
  else {
    if (EVar1 < Invalid) {
      local_1e = infos_[uVar2 * 0x48 + 0x38];
    }
    else {
      local_1e = (uchar)(-EVar1 >> 9);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_1e);
    EVar1 = this->enum_;
    if ((ulong)EVar1 < 0x21c) {
      value = *(uint32_t *)(infos_ + (ulong)EVar1 * 0x48 + 0x3c);
    }
    else {
      value = -EVar1 & 0xff;
    }
    OVar3 = WriteU32Leb128Raw(local_1d,&stack0xffffffffffffffe8,value);
    if (OVar3 == 0) {
      __assert_fail("length != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/opcode.cc"
                    ,0x1a5,"std::vector<uint8_t> wabt::Opcode::GetBytes() const");
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish,local_1d,local_1d + OVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> Opcode::GetBytes() const {
  std::vector<uint8_t> result;
  if (HasPrefix()) {
    result.push_back(GetPrefix());
    uint8_t buffer[5];
    Offset length =
        WriteU32Leb128Raw(buffer, buffer + sizeof(buffer), GetCode());
    assert(length != 0);
    result.insert(result.end(), buffer, buffer + length);
  } else {
    result.push_back(GetCode());
  }
  return result;
}